

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void __thiscall
pbrt::FilterSampler::FilterSampler(FilterSampler *this,FilterHandle *filter,Allocator alloc)

{
  Array2D<float> *this_00;
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  int y;
  int y_00;
  int x;
  int x_00;
  undefined1 auVar4 [16];
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  Point2f p;
  Tuple2<pbrt::Point2,_float> local_b8;
  PiecewiseConstant2D local_b0;
  undefined1 extraout_var [56];
  
  local_b8 = *(Tuple2<pbrt::Point2,_float> *)
              ((filter->
               super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
               ).bits & 0xffffffffffff);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = local_b8.x;
  auVar6._4_4_ = local_b8.y;
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(auVar6,auVar4);
  local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4);
  Bounds2<float>::Bounds2(&this->domain,(Point2<float> *)&local_b0,(Point2<float> *)&local_b8);
  this_00 = &this->values;
  uVar1 = *(ulong *)((filter->
                     super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                     ).bits & 0xffffffffffff);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar4 = vmovshdup_avx(auVar7);
  Array2D<float>::Array2D
            (this_00,(int)((float)uVar1 * 32.0),(int)(auVar4._0_4_ * 32.0),
             (allocator_type)alloc.memoryResource);
  PiecewiseConstant2D::PiecewiseConstant2D(&this->distrib,alloc);
  for (y_00 = 0;
      y_00 < (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
             (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y; y_00 = y_00 + 1) {
    for (x_00 = 0;
        iVar2 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x, x_00 < iVar2;
        x_00 = x_00 + 1) {
      auVar8._0_4_ = ((float)x_00 + 0.5) / (float)iVar2;
      auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar4 = vinsertps_avx(auVar8,ZEXT416((uint)(((float)y_00 + 0.5) /
                                                  (float)((this->values).extent.pMax.
                                                          super_Tuple2<pbrt::Point2,_int>.y -
                                                         (this->values).extent.pMin.
                                                         super_Tuple2<pbrt::Point2,_int>.y))),0x10);
      auVar9._0_8_ = Bounds2<float>::Lerp(&this->domain,auVar4._0_8_);
      auVar9._8_56_ = extraout_var;
      local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float> =
           (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9._0_16_);
      FVar5 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
              ::
              Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                          *)filter,(Point2f *)&local_b0);
      pfVar3 = Array2D<float>::operator()(this_00,x_00,y_00);
      *pfVar3 = FVar5;
    }
  }
  PiecewiseConstant2D::PiecewiseConstant2D(&local_b0,this_00,this->domain,alloc);
  PiecewiseConstant2D::operator=(&this->distrib,&local_b0);
  PiecewiseConstant2D::~PiecewiseConstant2D(&local_b0);
  return;
}

Assistant:

FilterSampler::FilterSampler(FilterHandle filter, Allocator alloc)
    : domain(Point2f(-filter.Radius()), Point2f(filter.Radius())),
      values(int(32 * filter.Radius().x), int(32 * filter.Radius().y), alloc),
      distrib(alloc) {
    // Tabularize filter function in _values_
    for (int y = 0; y < values.ySize(); ++y)
        for (int x = 0; x < values.xSize(); ++x) {
            Point2f p = domain.Lerp(
                Point2f((x + 0.5f) / values.xSize(), (y + 0.5f) / values.ySize()));
            values(x, y) = filter.Evaluate(p);
        }

    // Compute sampling distribution for filter
    distrib = PiecewiseConstant2D(values, domain, alloc);
}